

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall
CVmObjGramProd::delete_marked_alts(CVmObjGramProd *this,vm_obj_id_t self,vm_obj_id_t dict)

{
  vmgram_alt_info **ppvVar1;
  int iVar2;
  vm_gram_ext *pvVar3;
  int in_EDX;
  ulong uVar4;
  CVmObjGramProd *in_RDI;
  size_t j_1;
  int rebuild;
  vmgram_alt_info *alt_1;
  size_t i_1;
  size_t j;
  vmgram_tok_info *tok;
  vmgram_alt_info *alt;
  size_t i;
  CVmObjDict *dictp;
  vmgram_alt_info **alts;
  undefined8 in_stack_ffffffffffffffa0;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffffa8;
  vm_obj_id_t in_stack_ffffffffffffffac;
  vmgram_alt_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  size_t sVar6;
  CVmObjDict *this_00;
  vmgram_tok_info *in_stack_ffffffffffffffc8;
  vmgram_alt_info *in_stack_ffffffffffffffd0;
  ulong local_28;
  
  pvVar3 = get_ext(in_RDI);
  ppvVar1 = pvVar3->alts_;
  if ((in_EDX != 0) && (G_predef_X.misc_vocab != 0)) {
    vm_objp(0);
    for (local_28 = 0; pvVar3 = get_ext(in_RDI), local_28 < pvVar3->alt_cnt_;
        local_28 = local_28 + 1) {
      in_stack_ffffffffffffffd0 = ppvVar1[local_28];
      if (in_stack_ffffffffffffffd0->del != 0) {
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffd0->toks;
        for (this_00 = (CVmObjDict *)0x0; this_00 < (CVmObjDict *)in_stack_ffffffffffffffd0->tok_cnt
            ; this_00 = (CVmObjDict *)((long)&(this_00->super_CVmObject)._vptr_CVmObject + 1)) {
          if ((in_stack_ffffffffffffffc8->typ == '\x03') &&
             (iVar2 = find_literal_in_alts
                                ((CVmObjGramProd *)in_stack_ffffffffffffffc8,(char *)this_00,
                                 in_stack_ffffffffffffffb8), iVar2 == 0)) {
            CVmObjDict::del_word
                      (this_00,(vm_obj_id_t)(in_stack_ffffffffffffffb8 >> 0x20),
                       (char *)in_stack_ffffffffffffffb0,
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (vm_obj_id_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                       (vm_prop_id_t)((ulong)in_stack_ffffffffffffffa0 >> 0x10));
          }
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1;
        }
      }
    }
  }
  pvVar3 = get_ext(in_RDI);
  sVar6 = pvVar3->alt_cnt_;
  do {
    do {
      if (sVar6 == 0) {
        check_circular_refs((CVmObjGramProd *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        return;
      }
      uVar4 = sVar6 - 1;
      in_stack_ffffffffffffffb0 = ppvVar1[sVar6 - 1];
      sVar6 = uVar4;
    } while (in_stack_ffffffffffffffb0->del == 0);
    in_stack_ffffffffffffffb0->del = 0;
    in_stack_ffffffffffffffac = 1;
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      if ((ppvVar1[uVar5]->del != 0) &&
         (ppvVar1[uVar5]->proc_obj == in_stack_ffffffffffffffb0->proc_obj)) {
        in_stack_ffffffffffffffac = 0;
        break;
      }
    }
    if (in_stack_ffffffffffffffac != 0) {
      build_alt_props((CVmObjGramProd *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    delete_alt_undo((CVmObjGramProd *)in_stack_ffffffffffffffd0,
                    (vm_obj_id_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                    (int)in_stack_ffffffffffffffc8);
    sVar6 = uVar4;
  } while( true );
}

Assistant:

void CVmObjGramProd::delete_marked_alts(
    VMG_ vm_obj_id_t self, vm_obj_id_t dict)
{
    /* get the alt list */
    vmgram_alt_info **alts = get_ext()->alts_;

    /* if there's a dictionary, delete the words that are no longer in use */
    if (dict != VM_INVALID_OBJ
        && G_predef->misc_vocab != VM_INVALID_PROP)
    {
        /* get the dictionary object, properly cast */
        CVmObjDict *dictp = (CVmObjDict *)vm_objp(vmg_ dict);

        /* run through the alternatives being deleted */
        for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
        {
            /* get this item */
            vmgram_alt_info *alt = alts[i];

            /* if it's not being deleted, skip it */
            if (!alt->del)
                continue;

            /* run through its token list looking for literals */
            vmgram_tok_info *tok = alt->toks;
            for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
            {
                /* 
                 *   if it's a literal, and it's not defined in a surviving
                 *   alternative, delete it from the dictionary 
                 */
                if (tok->typ == VMGRAM_MATCH_LITERAL
                    && !find_literal_in_alts(
                        tok->typinfo.lit.str,tok->typinfo.lit.len))
                {
                    /* it's no longer used - remove it from the dictionary */
                    dictp->del_word(
                        vmg_ dict, tok->typinfo.lit.str, tok->typinfo.lit.len,
                        self, G_predef->misc_vocab);
                }
            }
        }
    }

    /* 
     *   Perform the deletions.  Work backwards from the end of the array to
     *   avoid overhead closing gaps in the array. 
     */
    for (size_t i = get_ext()->alt_cnt_ ; i > 0 ; )
    {
        /* get the next item */
        vmgram_alt_info *alt = alts[--i];

        /* if it's marked for deletion, delete it */
        if (alt->del)
        {
            /* unmark it, in case we later restore it via undo */
            alt->del = FALSE;

            /* 
             *   If this is the only remaining alternative with the same
             *   match object that's being deleted, rebuild the match
             *   object's grammarAltProps list.  If there's another
             *   alternative yet to be deleted that uses the same match
             *   object, don't bother doing the rebuild now, since we'll do
             *   it again when the loop reaches the earlier alternative, and
             *   we only need to do it once for the whole batch.  
             */
            int rebuild = TRUE;
            for (size_t j = 0 ; j < i ; ++j)
            {
                /* 
                 *   if this one's being deleted, and it has the same match
                 *   object, skip the rebuild now since we'll do it when we
                 *   get to 'j' in the main loop 
                 */
                if (alts[j]->del && alts[j]->proc_obj == alt->proc_obj)
                {
                    rebuild = FALSE;
                    break;
                }
            }

            /* do the rebuild if this is our last chance */
            if (rebuild)
                build_alt_props(vmg_ alt->proc_obj);

            /* delete it */
            delete_alt_undo(vmg_ self, i);
        }
    }

    /* check for circular references */
    check_circular_refs(self);
}